

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

uchar * CompressData(uchar *data,int dataLength,int *compDataLength)

{
  int iVar1;
  uchar *out;
  int iVar2;
  sdefl sStack_c0b7c;
  
  iVar1 = (dataLength * 0x6e) / 100 + 0x80;
  iVar2 = (dataLength / 0x7c00) * 5 + dataLength + 0x85;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  out = (uchar *)calloc((long)iVar2,1);
  memset(&sStack_c0b7c,0,0xc0b54);
  iVar2 = sdefl_compr(&sStack_c0b7c,out,data,dataLength,8);
  *compDataLength = iVar2;
  TraceLog(3,"SYSTEM: Compress data: Original size: %i -> Comp. size: %i",(ulong)(uint)dataLength,
           compDataLength);
  return out;
}

Assistant:

unsigned char *CompressData(unsigned char *data, int dataLength, int *compDataLength)
{
    #define COMPRESSION_QUALITY_DEFLATE  8

    unsigned char *compData = NULL;

#if defined(SUPPORT_COMPRESSION_API)
    // Compress data and generate a valid DEFLATE stream
    struct sdefl sdefl = { 0 };
    int bounds = sdefl_bound(dataLength);
    compData = (unsigned char *)RL_CALLOC(bounds, 1);
    *compDataLength = sdeflate(&sdefl, compData, data, dataLength, COMPRESSION_QUALITY_DEFLATE);   // Compression level 8, same as stbwi

    TraceLog(LOG_INFO, "SYSTEM: Compress data: Original size: %i -> Comp. size: %i", dataLength, compDataLength);
#endif

    return compData;
}